

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

ParseArgumentStatus __thiscall
google::protobuf::compiler::CommandLineInterface::InterpretArgument
          (CommandLineInterface *this,string *name,string *value)

{
  pointer pcVar1;
  lts_20250127 *plVar2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  ostream *poVar7;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>_>
  pbVar8;
  GeneratorInfo *pGVar9;
  AlphaNum *pAVar10;
  int version;
  ulong uVar11;
  char *pcVar12;
  char cVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  string *psVar14;
  char *in_R9;
  long lVar15;
  string_view sp;
  string_view sp_00;
  string_view name_00;
  string_view name_01;
  string_view suffix;
  string_view prefix;
  string_view suffix_00;
  string_view plugin_prefix;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view directive;
  string disk_path;
  string virtual_path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  direct;
  string local_b8 [8];
  undefined1 local_b0 [24];
  _Alloc_hider local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  *local_78;
  ByAnyChar local_70;
  ByAnyChar local_50;
  
  if (name->_M_string_length == 0) {
    if (value->_M_string_length != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->input_files_,value);
      return PARSE_ARGUMENT_DONE_AND_CONTINUE;
    }
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "You seem to have passed an empty string as one of the arguments to ");
    poVar7 = std::operator<<(poVar7,(string *)this);
    pcVar12 = 
    ".  This is actually sort of hard to do.  Congrats.  Unfortunately it is not valid input so the program is going to die now."
    ;
  }
  else {
    bVar4 = std::operator==(name,"-I");
    if ((bVar4) || (bVar4 = std::operator==(name,"--proto_path"), bVar4)) {
      pcVar1 = (value->_M_dataplus)._M_p;
      plVar2 = (lts_20250127 *)value->_M_string_length;
      sp._M_str = ":";
      sp._M_len = 1;
      absl::lts_20250127::ByAnyChar::ByAnyChar(&local_50,sp);
      absl::lts_20250127::StrSplit<absl::lts_20250127::ByAnyChar,absl::lts_20250127::SkipEmpty>
                (&direct,plVar2,pcVar1,&local_50);
      absl::lts_20250127::strings_internal::
      Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
      ::
      operator_vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_nullptr>
                (&parts,(Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                         *)&direct);
      uVar11 = 0xffffffffffffffff;
      std::__cxx11::string::~string
                ((string *)
                 &direct.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)&local_50);
      local_78 = (vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                  *)&this->proto_path_;
      lVar15 = 0;
      while (uVar11 = uVar11 + 1,
            uVar11 < (ulong)((long)parts.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)parts.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5)) {
        virtual_path._M_dataplus._M_p = (pointer)&virtual_path.field_2;
        virtual_path._M_string_length = 0;
        disk_path._M_dataplus._M_p = (pointer)&disk_path.field_2;
        disk_path._M_string_length = 0;
        virtual_path.field_2._M_local_buf[0] = '\0';
        disk_path.field_2._M_local_buf[0] = '\0';
        lVar6 = std::__cxx11::string::find
                          ((char)parts.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + (char)lVar15,0x3d);
        if (lVar6 == -1) {
          std::__cxx11::string::assign((char *)&virtual_path);
          std::__cxx11::string::_M_assign((string *)&disk_path);
        }
        else {
          std::__cxx11::string::substr
                    ((ulong)&direct,
                     (long)&((parts.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar15
                    );
          std::__cxx11::string::operator=((string *)&virtual_path,(string *)&direct);
          std::__cxx11::string::~string((string *)&direct);
          std::__cxx11::string::substr
                    ((ulong)&direct,
                     (long)&((parts.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar15
                    );
          std::__cxx11::string::operator=((string *)&disk_path,(string *)&direct);
          std::__cxx11::string::~string((string *)&direct);
        }
        sVar3 = disk_path._M_string_length;
        if (disk_path._M_string_length == 0) {
          poVar7 = std::operator<<((ostream *)&std::cerr,
                                   "--proto_path passed empty directory name.  (Use \".\" for current directory.)"
                                  );
          std::endl<char,std::char_traits<char>>(poVar7);
        }
        else {
          iVar5 = access(disk_path._M_dataplus._M_p,0);
          if (iVar5 < 0) {
            iVar5 = access(*(char **)((long)&((parts.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar15),0);
            if (iVar5 < 0) {
              poVar7 = std::operator<<((ostream *)&std::cerr,(string *)&disk_path);
              poVar7 = std::operator<<(poVar7,": warning: directory does not exist.");
              std::endl<char,std::char_traits<char>>(poVar7);
            }
            else {
              std::__cxx11::string::assign((char *)&virtual_path);
              std::__cxx11::string::_M_assign((string *)&disk_path);
            }
          }
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&direct,&virtual_path,&disk_path);
          std::
          vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
          ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    (local_78,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&direct);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&direct);
        }
        lVar15 = lVar15 + 0x20;
        std::__cxx11::string::~string((string *)&disk_path);
        std::__cxx11::string::~string((string *)&virtual_path);
        if (sVar3 == 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&parts);
          return PARSE_ARGUMENT_FAIL;
        }
      }
      this_00 = &parts;
LAB_0013d783:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(this_00);
      return PARSE_ARGUMENT_DONE_AND_CONTINUE;
    }
    bVar4 = std::operator==(name,"--direct_dependencies");
    if (bVar4) {
      if (this->direct_dependencies_explicitly_set_ != true) {
        this->direct_dependencies_explicitly_set_ = true;
        virtual_path._M_string_length = (size_type)(value->_M_dataplus)._M_p;
        virtual_path._M_dataplus._M_p = (pointer)value->_M_string_length;
        virtual_path.field_2._M_local_buf[0] = ':';
        absl::lts_20250127::strings_internal::
        Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
        ::
        operator_vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_nullptr>
                  (&direct,(Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                            *)&virtual_path);
        bVar4 = absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(&(this->direct_dependencies_).
                         super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       );
        if (!bVar4) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&virtual_path,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                     ,0x84c,"direct_dependencies_.empty()");
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&virtual_path);
        }
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
        ::
        insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                    *)&this->direct_dependencies_,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )direct.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )direct.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        this_00 = &direct;
        goto LAB_0013d783;
      }
      poVar7 = std::operator<<((ostream *)&std::cerr,(string *)name);
      pcVar12 = 
      " may only be passed once. To specify multiple direct dependencies, pass them all as a single parameter separated by \':\'."
      ;
    }
    else {
      bVar4 = std::operator==(name,"--direct_dependencies_violation_msg");
      if (bVar4) {
        psVar14 = (string *)&this->direct_dependencies_violation_msg_;
LAB_0013d82b:
        std::__cxx11::string::_M_assign(psVar14);
        return PARSE_ARGUMENT_DONE_AND_CONTINUE;
      }
      bVar4 = std::operator==(name,"--descriptor_set_in");
      if (bVar4) {
        if ((this->descriptor_set_in_names_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (this->descriptor_set_in_names_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          plVar2 = (lts_20250127 *)value->_M_string_length;
          if (plVar2 == (lts_20250127 *)0x0) {
LAB_0013e175:
            poVar7 = std::operator<<((ostream *)&std::cerr,(string *)name);
            pcVar12 = " requires a non-empty value.";
          }
          else {
            if ((this->dependency_out_name_)._M_string_length == 0) {
              pcVar1 = (value->_M_dataplus)._M_p;
              sp_00._M_str = ":";
              sp_00._M_len = 1;
              absl::lts_20250127::ByAnyChar::ByAnyChar(&local_70,sp_00);
              absl::lts_20250127::
              StrSplit<absl::lts_20250127::ByAnyChar,absl::lts_20250127::SkipEmpty>
                        (&direct,plVar2,pcVar1,&local_70);
              absl::lts_20250127::strings_internal::
              Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
              ::
              operator_vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_nullptr>
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&virtual_path,
                         (Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                          *)&direct);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::_M_move_assign(&this->descriptor_set_in_names_,&virtual_path);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&virtual_path);
              std::__cxx11::string::~string
                        ((string *)
                         &direct.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              psVar14 = (string *)&local_70;
LAB_0013daa5:
              std::__cxx11::string::~string(psVar14);
              return PARSE_ARGUMENT_DONE_AND_CONTINUE;
            }
            poVar7 = std::operator<<((ostream *)&std::cerr,(string *)name);
            pcVar12 = " cannot be used with --dependency_out.";
          }
        }
        else {
          poVar7 = std::operator<<((ostream *)&std::cerr,(string *)name);
          poVar7 = std::operator<<(poVar7,
                                   " may only be passed once. To specify multiple descriptor sets, pass them all as a single parameter separated by \'"
                                  );
          poVar7 = std::operator<<(poVar7,":");
          pcVar12 = "\'.";
        }
      }
      else {
        bVar4 = std::operator==(name,"-o");
        if ((bVar4) || (bVar4 = std::operator==(name,"--descriptor_set_out"), bVar4)) {
          if ((this->descriptor_set_out_name_)._M_string_length == 0) {
            if (value->_M_string_length == 0) goto LAB_0013e175;
            if (this->mode_ == MODE_COMPILE) {
              psVar14 = (string *)&this->descriptor_set_out_name_;
              goto LAB_0013d82b;
            }
            poVar7 = (ostream *)&std::cerr;
            pcVar12 = "Cannot use --encode or --decode and generate descriptors at the same time.";
            goto LAB_0013d7ed;
          }
        }
        else {
          bVar4 = std::operator==(name,"--dependency_out");
          if (bVar4) {
            if ((this->dependency_out_name_)._M_string_length == 0) {
              if (value->_M_string_length == 0) goto LAB_0013e175;
              if ((this->descriptor_set_in_names_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  (this->descriptor_set_in_names_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                psVar14 = (string *)&this->dependency_out_name_;
                goto LAB_0013d82b;
              }
              poVar7 = std::operator<<((ostream *)&std::cerr,(string *)name);
              pcVar12 = " cannot be used with --descriptor_set_in.";
              goto LAB_0013d7ed;
            }
          }
          else {
            bVar4 = std::operator==(name,"--include_imports");
            if (bVar4) {
              if (this->imports_in_descriptor_set_ != true) {
                this->imports_in_descriptor_set_ = true;
                return PARSE_ARGUMENT_DONE_AND_CONTINUE;
              }
            }
            else {
              bVar4 = std::operator==(name,"--include_source_info");
              if (bVar4) {
                if (this->source_info_in_descriptor_set_ != true) {
                  this->source_info_in_descriptor_set_ = true;
                  return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                }
              }
              else {
                bVar4 = std::operator==(name,"--retain_options");
                if (!bVar4) {
                  bVar4 = std::operator==(name,"-h");
                  if ((bVar4) || (bVar4 = std::operator==(name,"--help"), bVar4)) {
                    PrintHelpText(this);
                    return PARSE_ARGUMENT_DONE_AND_EXIT;
                  }
                  bVar4 = std::operator==(name,"--version");
                  if (bVar4) {
                    if ((this->version_info_)._M_string_length != 0) {
                      poVar7 = std::operator<<((ostream *)&std::cout,(string *)&this->version_info_)
                      ;
                      std::endl<char,std::char_traits<char>>(poVar7);
                    }
                    poVar7 = std::operator<<((ostream *)&std::cout,"libprotoc ");
                    protobuf::internal::ProtocVersionString_abi_cxx11_
                              ((string *)&direct,(internal *)0x5c0698,version);
                    poVar7 = std::operator<<(poVar7,(string *)&direct);
                    poVar7 = std::operator<<(poVar7,"-dev");
                    std::endl<char,std::char_traits<char>>(poVar7);
                    std::__cxx11::string::~string((string *)&direct);
                    return PARSE_ARGUMENT_DONE_AND_EXIT;
                  }
                  bVar4 = std::operator==(name,"--disallow_services");
                  if (bVar4) {
                    this->disallow_services_ = true;
                    return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                  }
                  bVar4 = std::operator==(name,"--experimental_allow_proto3_optional");
                  if (bVar4) {
                    return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                  }
                  bVar4 = std::operator==(name,"--encode");
                  if (((bVar4) || (bVar4 = std::operator==(name,"--decode"), bVar4)) ||
                     (bVar4 = std::operator==(name,"--decode_raw"), bVar4)) {
                    if (this->mode_ == MODE_COMPILE) {
                      if (((this->output_directives_).
                           super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                           ._M_impl.super__Vector_impl_data._M_start ==
                           (this->output_directives_).
                           super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                           ._M_impl.super__Vector_impl_data._M_finish) &&
                         ((this->descriptor_set_out_name_)._M_string_length == 0)) {
                        bVar4 = std::operator==(name,"--encode");
                        this->mode_ = MODE_DECODE - bVar4;
                        if (value->_M_string_length == 0) {
                          bVar4 = std::operator!=(name,"--decode_raw");
                          if (bVar4) {
                            poVar7 = std::operator<<((ostream *)&std::cerr,"Type name for ");
                            poVar7 = std::operator<<(poVar7,(string *)name);
                            poVar7 = std::operator<<(poVar7," cannot be blank.");
                            std::endl<char,std::char_traits<char>>(poVar7);
                            bVar4 = std::operator==(name,"--decode");
                            if (!bVar4) {
                              return PARSE_ARGUMENT_FAIL;
                            }
                            pcVar12 = "To decode an unknown message, use --decode_raw.";
                            goto LAB_0013dddf;
                          }
                          if (value->_M_string_length != 0) goto LAB_0013dced;
                        }
                        else {
LAB_0013dced:
                          bVar4 = std::operator==(name,"--decode_raw");
                          if (bVar4) {
                            pcVar12 = "--decode_raw does not take a parameter.";
LAB_0013dddf:
                            poVar7 = std::operator<<((ostream *)&std::cerr,pcVar12);
                            std::endl<char,std::char_traits<char>>(poVar7);
                            return PARSE_ARGUMENT_FAIL;
                          }
                        }
                        psVar14 = (string *)&this->codec_type_;
LAB_0013de33:
                        std::__cxx11::string::_M_assign(psVar14);
                        return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                      }
LAB_0013e093:
                      poVar7 = std::operator<<((ostream *)&std::cerr,"Cannot use ");
                      poVar7 = std::operator<<(poVar7,(string *)name);
                      pcVar12 = " and generate code or descriptors at the same time.";
                    }
                    else {
                      poVar7 = (ostream *)&std::cerr;
                      pcVar12 = "Only one of --encode and --decode can be specified.";
                    }
                  }
                  else {
                    bVar4 = std::operator==(name,"--deterministic_output");
                    if (bVar4) {
                      this->deterministic_output_ = true;
                      return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                    }
                    bVar4 = std::operator==(name,"--error_format");
                    if (bVar4) {
                      bVar4 = std::operator==(value,"gcc");
                      if (bVar4) {
                        this->error_format_ = ERROR_FORMAT_GCC;
                        return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                      }
                      bVar4 = std::operator==(value,"msvs");
                      if (bVar4) {
                        this->error_format_ = ERROR_FORMAT_MSVS;
                        return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                      }
                      poVar7 = std::operator<<((ostream *)&std::cerr,"Unknown error format: ");
LAB_0013df3d:
                      poVar7 = std::operator<<(poVar7,(string *)value);
                      goto LAB_0013d7f2;
                    }
                    bVar4 = std::operator==(name,"--fatal_warnings");
                    if (bVar4) {
                      if (this->fatal_warnings_ != true) {
                        this->fatal_warnings_ = true;
                        return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                      }
                      goto LAB_0013d92b;
                    }
                    bVar4 = std::operator==(name,"--plugin");
                    cVar13 = (char)value;
                    if (bVar4) {
                      if ((this->plugin_prefix_)._M_string_length != 0) {
                        direct.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                        direct.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start =
                             (pointer)&direct.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                        direct.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                        virtual_path._M_dataplus._M_p = (pointer)&virtual_path.field_2;
                        virtual_path._M_string_length = 0;
                        virtual_path.field_2._M_local_buf[0] = '\0';
                        lVar15 = std::__cxx11::string::find(cVar13,0x3d);
                        if (lVar15 == -1) {
                          lVar15 = std::__cxx11::string::rfind(cVar13,0x2f);
                          if (lVar15 == -1) {
                            std::__cxx11::string::_M_assign((string *)&direct);
                          }
                          else {
                            std::__cxx11::string::substr((ulong)&disk_path,(ulong)value);
                            std::__cxx11::string::operator=((string *)&direct,(string *)&disk_path);
                            std::__cxx11::string::~string((string *)&disk_path);
                          }
                          std::__cxx11::string::_M_assign((string *)&virtual_path);
                        }
                        else {
                          std::__cxx11::string::substr((ulong)&disk_path,(ulong)value);
                          std::__cxx11::string::operator=((string *)&direct,(string *)&disk_path);
                          std::__cxx11::string::~string((string *)&disk_path);
                          std::__cxx11::string::substr((ulong)&disk_path,(ulong)value);
                          std::__cxx11::string::operator=
                                    ((string *)&virtual_path,(string *)&disk_path);
                          std::__cxx11::string::~string((string *)&disk_path);
                        }
                        pbVar8 = absl::lts_20250127::container_internal::
                                 raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                 ::
                                 operator[]<std::__cxx11::string,absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>>
                                           ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                             *)&this->plugins_,
                                            (key_arg<std::__cxx11::basic_string<char>_> *)&direct);
                        std::__cxx11::string::_M_assign((string *)pbVar8);
                        std::__cxx11::string::~string((string *)&virtual_path);
                        psVar14 = (string *)&direct;
                        goto LAB_0013daa5;
                      }
                      poVar7 = (ostream *)&std::cerr;
                      pcVar12 = "This compiler does not support plugins.";
                    }
                    else {
                      bVar4 = std::operator==(name,"--print_free_field_numbers");
                      if (bVar4) {
                        if (this->mode_ == MODE_COMPILE) {
                          if (((this->output_directives_).
                               super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                               ._M_impl.super__Vector_impl_data._M_start ==
                               (this->output_directives_).
                               super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                               ._M_impl.super__Vector_impl_data._M_finish) &&
                             ((this->descriptor_set_out_name_)._M_string_length == 0)) {
                            this->mode_ = MODE_PRINT;
                            this->print_mode_ = PRINT_FREE_FIELDS;
                            return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                          }
                          goto LAB_0013e093;
                        }
                        poVar7 = std::operator<<((ostream *)&std::cerr,"Cannot use ");
                        poVar7 = std::operator<<(poVar7,(string *)name);
                        poVar7 = std::operator<<(poVar7," and use --encode, --decode or print ");
                        pcVar12 = "other info at the same time.";
                      }
                      else {
                        bVar4 = std::operator==(name,"--enable_codegen_trace");
                        if (bVar4) {
                          setenv("PROTOC_CODEGEN_TRACE","yes",0);
                          return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                        }
                        bVar4 = std::operator==(name,"--notices");
                        if (bVar4) {
                          poVar7 = std::operator<<((ostream *)&std::cout,notices_text);
                          std::endl<char,std::char_traits<char>>(poVar7);
                          return PARSE_ARGUMENT_DONE_AND_EXIT;
                        }
                        bVar4 = std::operator==(name,"--experimental_editions");
                        if (bVar4) {
                          this->experimental_editions_ = true;
                          return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                        }
                        bVar4 = std::operator==(name,"--edition_defaults_out");
                        if (bVar4) {
                          if ((this->edition_defaults_out_name_)._M_string_length != 0)
                          goto LAB_0013d92b;
                          if (value->_M_string_length == 0) goto LAB_0013e175;
                          if (this->mode_ == MODE_COMPILE) {
                            psVar14 = (string *)&this->edition_defaults_out_name_;
                            goto LAB_0013de33;
                          }
                          poVar7 = (ostream *)&std::cerr;
                          pcVar12 = 
                          "Cannot use --encode or --decode and generate defaults at the same time.";
                        }
                        else {
                          bVar4 = std::operator==(name,"--edition_defaults_minimum");
                          if (bVar4) {
                            if (this->edition_defaults_minimum_ != EDITION_UNKNOWN)
                            goto LAB_0013d92b;
                            direct.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._0_16_ =
                                 absl::lts_20250127::NullSafeStringView("EDITION_");
                            virtual_path._M_string_length = (size_type)(value->_M_dataplus)._M_p;
                            pAVar10 = (AlphaNum *)value->_M_string_length;
                            virtual_path._M_dataplus._M_p = (pointer)pAVar10;
                            absl::lts_20250127::StrCat_abi_cxx11_
                                      (&disk_path,(lts_20250127 *)&direct,(AlphaNum *)&virtual_path,
                                       pAVar10);
                            name_00._M_str = (char *)&this->edition_defaults_minimum_;
                            name_00._M_len = (size_t)disk_path._M_dataplus._M_p;
                            bVar4 = Edition_Parse((protobuf *)disk_path._M_string_length,name_00,
                                                  (Edition *)pAVar10);
                          }
                          else {
                            bVar4 = std::operator==(name,"--edition_defaults_maximum");
                            if (!bVar4) {
                              pGVar9 = FindGeneratorByFlag(this,name);
                              if ((pGVar9 == (GeneratorInfo *)0x0) &&
                                 (((this->plugin_prefix_)._M_string_length == 0 ||
                                  (suffix._M_str = "_out", suffix._M_len = 4,
                                  text._M_str = (name->_M_dataplus)._M_p,
                                  text._M_len = name->_M_string_length,
                                  bVar4 = absl::lts_20250127::EndsWith(text,suffix), !bVar4)))) {
                                pGVar9 = FindGeneratorByOption(this,name);
                                if (pGVar9 != (GeneratorInfo *)0x0) {
                                  pbVar8 = absl::lts_20250127::container_internal::
                                           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                           ::
                                           operator[]<std::__cxx11::string,absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>>
                                                     ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                                  *)&this->generator_parameters_,&pGVar9->flag_name)
                                  ;
                                  sVar3 = pbVar8->_M_string_length;
joined_r0x0013e33a:
                                  if (sVar3 != 0) {
                                    std::__cxx11::string::append((char *)pbVar8);
                                  }
                                  std::__cxx11::string::append((string *)pbVar8);
                                  return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                                }
                                prefix._M_str = "--";
                                prefix._M_len = 2;
                                text_00._M_str = (name->_M_dataplus)._M_p;
                                text_00._M_len = name->_M_string_length;
                                bVar4 = absl::lts_20250127::StartsWith(text_00,prefix);
                                if ((bVar4) &&
                                   (suffix_00._M_str = "_opt", suffix_00._M_len = 4,
                                   text_01._M_str = (name->_M_dataplus)._M_p,
                                   text_01._M_len = name->_M_string_length,
                                   bVar4 = absl::lts_20250127::EndsWith(text_01,suffix_00), bVar4))
                                {
                                  plugin_prefix._M_str = (char *)name->_M_string_length;
                                  plugin_prefix._M_len =
                                       (size_t)(this->plugin_prefix_)._M_dataplus._M_p;
                                  directive._M_str = in_R9;
                                  directive._M_len = (size_t)(name->_M_dataplus)._M_p;
                                  compiler::(anonymous_namespace)::PluginName_abi_cxx11_
                                            ((string *)&direct,
                                             (_anonymous_namespace_ *)
                                             (this->plugin_prefix_)._M_string_length,plugin_prefix,
                                             directive);
                                  pbVar8 = absl::lts_20250127::container_internal::
                                           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           ::
                                           operator[]<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nullptr>
                                                     (&(this->plugin_parameters_).
                                                                                                              
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ,(string *)&direct);
                                  std::__cxx11::string::~string((string *)&direct);
                                  sVar3 = pbVar8->_M_string_length;
                                  goto joined_r0x0013e33a;
                                }
                                poVar7 = std::operator<<((ostream *)&std::cerr,"Unknown flag: ");
                                value = name;
                                goto LAB_0013df3d;
                              }
                              if (this->mode_ == MODE_COMPILE) {
                                direct.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                                direct.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start =
                                     (pointer)&direct.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                direct.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                                local_b8 = (string  [8])(local_b0 + 8);
                                local_b0._0_8_ = 0;
                                local_b0[8] = '\0';
                                local_98._M_p = (pointer)&local_88;
                                local_90 = 0;
                                local_88._M_local_buf[0] = '\0';
                                std::__cxx11::string::_M_assign((string *)&direct);
                                lVar15 = std::__cxx11::string::find(cVar13,0x3a);
                                if (lVar15 == -1) {
                                  std::__cxx11::string::_M_assign((string *)&local_98);
                                }
                                else {
                                  std::__cxx11::string::substr((ulong)&virtual_path,(ulong)value);
                                  std::__cxx11::string::operator=(local_b8,(string *)&virtual_path);
                                  std::__cxx11::string::~string((string *)&virtual_path);
                                  std::__cxx11::string::substr((ulong)&virtual_path,(ulong)value);
                                  std::__cxx11::string::operator=
                                            ((string *)&local_98,(string *)&virtual_path);
                                  std::__cxx11::string::~string((string *)&virtual_path);
                                }
                                std::
                                vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                                ::push_back(&this->output_directives_,(value_type *)&direct);
                                OutputDirective::~OutputDirective((OutputDirective *)&direct);
                                return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                              }
                              poVar7 = (ostream *)&std::cerr;
                              pcVar12 = 
                              "Cannot use --encode, --decode or print .proto info and generate code at the same time."
                              ;
                              goto LAB_0013d7ed;
                            }
                            if (this->edition_defaults_maximum_ != EDITION_UNKNOWN)
                            goto LAB_0013d92b;
                            direct.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._0_16_ =
                                 absl::lts_20250127::NullSafeStringView("EDITION_");
                            virtual_path._M_string_length = (size_type)(value->_M_dataplus)._M_p;
                            pAVar10 = (AlphaNum *)value->_M_string_length;
                            virtual_path._M_dataplus._M_p = (pointer)pAVar10;
                            absl::lts_20250127::StrCat_abi_cxx11_
                                      (&disk_path,(lts_20250127 *)&direct,(AlphaNum *)&virtual_path,
                                       pAVar10);
                            name_01._M_str = (char *)&this->edition_defaults_maximum_;
                            name_01._M_len = (size_t)disk_path._M_dataplus._M_p;
                            bVar4 = Edition_Parse((protobuf *)disk_path._M_string_length,name_01,
                                                  (Edition *)pAVar10);
                          }
                          std::__cxx11::string::~string((string *)&disk_path);
                          if (bVar4 != false) {
                            return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                          }
                          poVar7 = std::operator<<((ostream *)&std::cerr,(string *)name);
                          poVar7 = std::operator<<(poVar7," unknown edition \"");
                          poVar7 = std::operator<<(poVar7,(string *)value);
                          pcVar12 = "\".";
                        }
                      }
                    }
                  }
                  goto LAB_0013d7ed;
                }
                if (this->retain_options_in_descriptor_set_ != true) {
                  this->retain_options_in_descriptor_set_ = true;
                  return PARSE_ARGUMENT_DONE_AND_CONTINUE;
                }
              }
            }
          }
        }
LAB_0013d92b:
        poVar7 = std::operator<<((ostream *)&std::cerr,(string *)name);
        pcVar12 = " may only be passed once.";
      }
    }
  }
LAB_0013d7ed:
  poVar7 = std::operator<<(poVar7,pcVar12);
LAB_0013d7f2:
  std::endl<char,std::char_traits<char>>(poVar7);
  return PARSE_ARGUMENT_FAIL;
}

Assistant:

CommandLineInterface::ParseArgumentStatus
CommandLineInterface::InterpretArgument(const std::string& name,
                                        const std::string& value) {
  if (name.empty()) {
    // Not a flag.  Just a filename.
    if (value.empty()) {
      std::cerr
          << "You seem to have passed an empty string as one of the "
             "arguments to "
          << executable_name_
          << ".  This is actually "
             "sort of hard to do.  Congrats.  Unfortunately it is not valid "
             "input so the program is going to die now."
          << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

#if defined(_WIN32)
    // On Windows, the shell (typically cmd.exe) does not expand wildcards in
    // file names (e.g. foo\*.proto), so we do it ourselves.
    switch (google::protobuf::io::win32::ExpandWildcards(
        value, [this](const std::string& path) {
          this->input_files_.push_back(path);
        })) {
      case google::protobuf::io::win32::ExpandWildcardsResult::kSuccess:
        break;
      case google::protobuf::io::win32::ExpandWildcardsResult::kErrorNoMatchingFile:
        // Path does not exist, is not a file, or it's longer than MAX_PATH and
        // long path handling is disabled.
        std::cerr << "Invalid file name pattern or missing input file \""
                  << value << "\"" << std::endl;
        return PARSE_ARGUMENT_FAIL;
      default:
        std::cerr << "Cannot convert path \"" << value
                  << "\" to or from Windows style" << std::endl;
        return PARSE_ARGUMENT_FAIL;
    }
#else   // not _WIN32
    // On other platforms than Windows (e.g. Linux, Mac OS) the shell (typically
    // Bash) expands wildcards.
    input_files_.push_back(value);
#endif  // _WIN32

  } else if (name == "-I" || name == "--proto_path") {
    // Java's -classpath (and some other languages) delimits path components
    // with colons.  Let's accept that syntax too just to make things more
    // intuitive.
    std::vector<std::string> parts = absl::StrSplit(
        value, absl::ByAnyChar(CommandLineInterface::kPathSeparator),
        absl::SkipEmpty());

    for (size_t i = 0; i < parts.size(); ++i) {
      std::string virtual_path;
      std::string disk_path;

      std::string::size_type equals_pos = parts[i].find_first_of('=');
      if (equals_pos == std::string::npos) {
        virtual_path = "";
        disk_path = parts[i];
      } else {
        virtual_path = parts[i].substr(0, equals_pos);
        disk_path = parts[i].substr(equals_pos + 1);
      }

      if (disk_path.empty()) {
        std::cerr
            << "--proto_path passed empty directory name.  (Use \".\" for "
               "current directory.)"
            << std::endl;
        return PARSE_ARGUMENT_FAIL;
      }

      // Make sure disk path exists, warn otherwise.
      if (access(disk_path.c_str(), F_OK) < 0) {
        // Try the original path; it may have just happened to have a '=' in it.
        if (access(parts[i].c_str(), F_OK) < 0) {
          std::cerr << disk_path << ": warning: directory does not exist."
                    << std::endl;
        } else {
          virtual_path = "";
          disk_path = parts[i];
        }
      }

      // Don't use make_pair as the old/default standard library on Solaris
      // doesn't support it without explicit template parameters, which are
      // incompatible with C++0x's make_pair.
      proto_path_.push_back(
          std::pair<std::string, std::string>(virtual_path, disk_path));
    }

  } else if (name == "--direct_dependencies") {
    if (direct_dependencies_explicitly_set_) {
      std::cerr << name
                << " may only be passed once. To specify multiple "
                   "direct dependencies, pass them all as a single "
                   "parameter separated by ':'."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    direct_dependencies_explicitly_set_ = true;
    std::vector<std::string> direct =
        absl::StrSplit(value, ':', absl::SkipEmpty());
    ABSL_DCHECK(direct_dependencies_.empty());
    direct_dependencies_.insert(direct.begin(), direct.end());

  } else if (name == "--direct_dependencies_violation_msg") {
    direct_dependencies_violation_msg_ = value;

  } else if (name == "--descriptor_set_in") {
    if (!descriptor_set_in_names_.empty()) {
      std::cerr << name
                << " may only be passed once. To specify multiple "
                   "descriptor sets, pass them all as a single "
                   "parameter separated by '"
                << CommandLineInterface::kPathSeparator << "'." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (value.empty()) {
      std::cerr << name << " requires a non-empty value." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (!dependency_out_name_.empty()) {
      std::cerr << name << " cannot be used with --dependency_out."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    descriptor_set_in_names_ = absl::StrSplit(
        value, absl::ByAnyChar(CommandLineInterface::kPathSeparator),
        absl::SkipEmpty());

  } else if (name == "-o" || name == "--descriptor_set_out") {
    if (!descriptor_set_out_name_.empty()) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (value.empty()) {
      std::cerr << name << " requires a non-empty value." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (mode_ != MODE_COMPILE) {
      std::cerr
          << "Cannot use --encode or --decode and generate descriptors at the "
             "same time."
          << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    descriptor_set_out_name_ = value;

  } else if (name == "--dependency_out") {
    if (!dependency_out_name_.empty()) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (value.empty()) {
      std::cerr << name << " requires a non-empty value." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (!descriptor_set_in_names_.empty()) {
      std::cerr << name << " cannot be used with --descriptor_set_in."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    dependency_out_name_ = value;

  } else if (name == "--include_imports") {
    if (imports_in_descriptor_set_) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    imports_in_descriptor_set_ = true;

  } else if (name == "--include_source_info") {
    if (source_info_in_descriptor_set_) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    source_info_in_descriptor_set_ = true;

  } else if (name == "--retain_options") {
    if (retain_options_in_descriptor_set_) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    retain_options_in_descriptor_set_ = true;

  } else if (name == "-h" || name == "--help") {
    PrintHelpText();
    return PARSE_ARGUMENT_DONE_AND_EXIT;  // Exit without running compiler.

  } else if (name == "--version") {
    if (!version_info_.empty()) {
      std::cout << version_info_ << std::endl;
    }
    std::cout << "libprotoc "
              << ::google::protobuf::internal::ProtocVersionString(
                     PROTOBUF_VERSION)
              << PROTOBUF_VERSION_SUFFIX << std::endl;
    return PARSE_ARGUMENT_DONE_AND_EXIT;  // Exit without running compiler.

  } else if (name == "--disallow_services") {
    disallow_services_ = true;
  } else if (name == "--experimental_allow_proto3_optional") {
    // Flag is no longer observed, but we allow it for backward compat.
  } else if (name == "--encode" || name == "--decode" ||
             name == "--decode_raw") {
    if (mode_ != MODE_COMPILE) {
      std::cerr << "Only one of --encode and --decode can be specified."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (!output_directives_.empty() || !descriptor_set_out_name_.empty()) {
      std::cerr << "Cannot use " << name
                << " and generate code or descriptors at the same time."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    mode_ = (name == "--encode") ? MODE_ENCODE : MODE_DECODE;

    if (value.empty() && name != "--decode_raw") {
      std::cerr << "Type name for " << name << " cannot be blank." << std::endl;
      if (name == "--decode") {
        std::cerr << "To decode an unknown message, use --decode_raw."
                  << std::endl;
      }
      return PARSE_ARGUMENT_FAIL;
    } else if (!value.empty() && name == "--decode_raw") {
      std::cerr << "--decode_raw does not take a parameter." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    codec_type_ = value;

  } else if (name == "--deterministic_output") {
    deterministic_output_ = true;

  } else if (name == "--error_format") {
    if (value == "gcc") {
      error_format_ = ERROR_FORMAT_GCC;
    } else if (value == "msvs") {
      error_format_ = ERROR_FORMAT_MSVS;
    } else {
      std::cerr << "Unknown error format: " << value << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

  } else if (name == "--fatal_warnings") {
    if (fatal_warnings_) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    fatal_warnings_ = true;
  } else if (name == "--plugin") {
    if (plugin_prefix_.empty()) {
      std::cerr << "This compiler does not support plugins." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    std::string plugin_name;
    std::string path;

    std::string::size_type equals_pos = value.find_first_of('=');
    if (equals_pos == std::string::npos) {
      // Use the basename of the file.
      std::string::size_type slash_pos = value.find_last_of('/');
      if (slash_pos == std::string::npos) {
        plugin_name = value;
      } else {
        plugin_name = value.substr(slash_pos + 1);
      }
      path = value;
    } else {
      plugin_name = value.substr(0, equals_pos);
      path = value.substr(equals_pos + 1);
    }

    plugins_[plugin_name] = path;

  } else if (name == "--print_free_field_numbers") {
    if (mode_ != MODE_COMPILE) {
      std::cerr << "Cannot use " << name
                << " and use --encode, --decode or print "
                << "other info at the same time." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (!output_directives_.empty() || !descriptor_set_out_name_.empty()) {
      std::cerr << "Cannot use " << name
                << " and generate code or descriptors at the same time."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    mode_ = MODE_PRINT;
    print_mode_ = PRINT_FREE_FIELDS;
  } else if (name == "--enable_codegen_trace") {
    // We use environment variables here so that subprocesses see this setting
    // when we spawn them.
    //
    // Setting environment variables is more-or-less asking for a data race,
    // because C got this wrong and did not mandate synchronization.
    // In practice, this code path is "only" in the main thread of protoc, and
    // it is common knowledge that touching setenv in a library is asking for
    // life-ruining bugs *anyways*. As such, there is a reasonable probability
    // that there isn't another thread kicking environment variables at this
    // moment.

#ifdef _WIN32
    ::_putenv(absl::StrCat(io::Printer::kProtocCodegenTrace, "=yes").c_str());
#else
    ::setenv(io::Printer::kProtocCodegenTrace.data(), "yes", 0);
#endif
  } else if (name == "--notices") {
    std::cout << notices_text << std::endl;
    return PARSE_ARGUMENT_DONE_AND_EXIT;
  } else if (name == "--experimental_editions") {
    // If you're reading this, you're probably wondering what
    // --experimental_editions is for and thinking of turning it on. This is an
    // experimental, undocumented, unsupported flag. Enable it at your own risk
    // (or, just don't!).
    experimental_editions_ = true;
  } else if (name == "--edition_defaults_out") {
    if (!edition_defaults_out_name_.empty()) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (value.empty()) {
      std::cerr << name << " requires a non-empty value." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (mode_ != MODE_COMPILE) {
      std::cerr
          << "Cannot use --encode or --decode and generate defaults at the "
             "same time."
          << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    edition_defaults_out_name_ = value;
  } else if (name == "--edition_defaults_minimum") {
    if (edition_defaults_minimum_ != EDITION_UNKNOWN) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (!Edition_Parse(absl::StrCat("EDITION_", value),
                       &edition_defaults_minimum_)) {
      std::cerr << name << " unknown edition \"" << value << "\"." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
  } else if (name == "--edition_defaults_maximum") {
    if (edition_defaults_maximum_ != EDITION_UNKNOWN) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (!Edition_Parse(absl::StrCat("EDITION_", value),
                       &edition_defaults_maximum_)) {
      std::cerr << name << " unknown edition \"" << value << "\"." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
  } else {
    // Some other flag.  Look it up in the generators list.
    const GeneratorInfo* generator_info = FindGeneratorByFlag(name);
    if (generator_info == nullptr &&
        (plugin_prefix_.empty() || !absl::EndsWith(name, "_out"))) {
      // Check if it's a generator option flag.
      generator_info = FindGeneratorByOption(name);
      if (generator_info != nullptr) {
        std::string* parameters =
            &generator_parameters_[generator_info->flag_name];
        if (!parameters->empty()) {
          parameters->append(",");
        }
        parameters->append(value);
      } else if (absl::StartsWith(name, "--") && absl::EndsWith(name, "_opt")) {
        std::string* parameters =
            &plugin_parameters_[PluginName(plugin_prefix_, name)];
        if (!parameters->empty()) {
          parameters->append(",");
        }
        parameters->append(value);
      } else {
        std::cerr << "Unknown flag: " << name << std::endl;
        return PARSE_ARGUMENT_FAIL;
      }
    } else {
      // It's an output flag.  Add it to the output directives.
      if (mode_ != MODE_COMPILE) {
        std::cerr << "Cannot use --encode, --decode or print .proto info and "
                     "generate code at the same time."
                  << std::endl;
        return PARSE_ARGUMENT_FAIL;
      }

      OutputDirective directive;
      directive.name = name;
      if (generator_info == nullptr) {
        directive.generator = nullptr;
      } else {
        directive.generator = generator_info->generator;
      }

      // Split value at ':' to separate the generator parameter from the
      // filename.  However, avoid doing this if the colon is part of a valid
      // Windows-style absolute path.
      std::string::size_type colon_pos = value.find_first_of(':');
      if (colon_pos == std::string::npos || IsWindowsAbsolutePath(value)) {
        directive.output_location = value;
      } else {
        directive.parameter = value.substr(0, colon_pos);
        directive.output_location = value.substr(colon_pos + 1);
      }

      output_directives_.push_back(directive);
    }
  }

  return PARSE_ARGUMENT_DONE_AND_CONTINUE;
}